

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  bool bVar1;
  cmAlphaNum local_d0;
  string local_a0;
  string local_80;
  cmAlphaNum local_60;
  
  GetDirectory(&local_80,this,config,artifact);
  local_d0.View_._M_len = local_80._M_string_length;
  local_d0.View_._M_str = local_80._M_dataplus._M_p;
  local_60.View_._M_len = 1;
  local_60.Digits_[0] = '/';
  local_60.View_._M_str = local_60.Digits_;
  cmStrCat<>(__return_storage_ptr__,&local_d0,&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildBundleDirectory(&local_a0,this,__return_storage_ptr__,config,FullLevel);
    local_d0.View_._M_len = local_a0._M_string_length;
    local_d0.View_._M_str = local_a0._M_dataplus._M_p;
    local_60.View_._M_len = 1;
    local_60.Digits_[0] = '/';
    local_60.View_._M_str = local_60.Digits_;
    cmStrCat<>(&local_80,&local_d0,&local_60);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if (artifact == ImportLibraryArtifact) {
    GetFullName((string *)&local_d0,this,config,ImportLibraryArtifact);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if (artifact != RuntimeBinaryArtifact) {
      return __return_storage_ptr__;
    }
    if (realname) {
      NormalGetRealName((string *)&local_d0,this,config);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      GetFullName((string *)&local_d0,this,config,RuntimeBinaryArtifact);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  if (this->IsAppBundleOnApple()) {
    fpath =
      cmStrCat(this->BuildBundleDirectory(fpath, config, FullLevel), '/');
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      fpath += this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      break;
  }
  return fpath;
}